

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarLocation.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::EnvironmentVarLocation::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EnvironmentVarLocation *this,EventRegistry *eventRegistry)

{
  long lVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  declared_positions;
  char *env_var_value;
  allocator local_49;
  string local_48 [8];
  string varName;
  EventRegistry *eventRegistry_local;
  EnvironmentVarLocation *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *licenseFileFoundWithEnvVariable;
  
  varName.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"LICENSE_LOCATION",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    pbVar2 = (pointer)getenv("LICENSE_LOCATION");
    declared_positions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
    if ((pbVar2 == (pointer)0x0) || (pbVar2->_M_dataplus == (_Alloc_hider)0x0)) {
      EventRegistry::addEvent
                (eventRegistry,ENVIRONMENT_VARIABLE_NOT_DEFINED,(char *)0x0,(char *)0x0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,(char *)pbVar2,&local_a1);
      split_string((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_80,&local_a0,';');
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      filter_existing_files
                (&local_c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80,eventRegistry,"LICENSE_LOCATION");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(__return_storage_ptr__,&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_80);
    }
  }
  varName.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_48);
  if ((varName.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<string> EnvironmentVarLocation::license_locations(EventRegistry &eventRegistry) {
	vector<string> licenseFileFoundWithEnvVariable;

	const string varName(LCC_LICENSE_LOCATION_ENV_VAR);
	if (varName.length() > 0) {
		// var name is defined in header files.
		char *env_var_value = getenv(LCC_LICENSE_LOCATION_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			const vector<string> declared_positions = license::split_string(string(env_var_value), ';');
			licenseFileFoundWithEnvVariable =
				license::filter_existing_files(declared_positions, eventRegistry, LCC_LICENSE_LOCATION_ENV_VAR);
		} else {
			eventRegistry.addEvent(ENVIRONMENT_VARIABLE_NOT_DEFINED);
		}
	}
	return licenseFileFoundWithEnvVariable;
}